

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

void Bac_NtkUpdateFanout(Bac_Ntk_t *p,int iOld,int iNew)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  
  if (-1 < iOld) {
    iVar2 = (p->vType).nSize;
    if (iOld < iVar2) {
      pcVar3 = (p->vType).pArray;
      bVar1 = pcVar3[(uint)iOld];
      if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) {
        __assert_fail("Bac_ObjIsCi(p, iOld)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                      ,0xda,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
      }
      if ((-1 < iNew) && (iNew < iVar2)) {
        uVar4 = (uint)(byte)pcVar3[(uint)iNew];
        if ((9 < uVar4) || ((0x30cU >> (uVar4 & 0x1f) & 1) == 0)) {
          __assert_fail("Bac_ObjIsCi(p, iNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                        ,0xdb,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
        }
        if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) {
LAB_0038a220:
          __assert_fail("Bac_ObjIsCi(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0x125,"int Bac_ObjFanout(Bac_Ntk_t *, int)");
        }
        if ((p->vFanout).nSize <= iOld) {
LAB_0038a166:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = (p->vFanout).pArray[(uint)iOld];
        if (uVar4 != 0) {
          do {
            if (((int)uVar4 < 0) || ((p->vType).nSize <= (int)uVar4)) goto LAB_0038a147;
            if (((p->vType).pArray[uVar4] & 0xfcU) != 4) {
LAB_0038a185:
              __assert_fail("Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
            }
            if ((p->vFanin).nSize <= (int)uVar4) goto LAB_0038a166;
            iVar2 = (p->vFanin).pArray[uVar4];
            if (iVar2 != iOld) {
              __assert_fail("Bac_ObjFanin(p, iCo) == iOld",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                            ,0xde,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
            }
            if (iVar2 < 0) {
              __assert_fail("Bac_ObjFanin(p, i) >= 0 && Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x129,"void Bac_ObjCleanFanin(Bac_Ntk_t *, int)");
            }
            Vec_IntSetEntry(&p->vFanin,uVar4,-1);
            if ((p->vType).nSize <= (int)uVar4) goto LAB_0038a147;
            if (((p->vType).pArray[uVar4] & 0xfcU) != 4) goto LAB_0038a185;
            if ((p->vFanin).nSize <= (int)uVar4) goto LAB_0038a166;
            if ((p->vFanin).pArray[uVar4] != -1) {
              __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
            }
            Vec_IntSetEntry(&p->vFanin,uVar4,iNew);
            if ((p->vType).nSize <= (int)uVar4) goto LAB_0038a147;
            if (((p->vType).pArray[uVar4] & 0xfcU) != 4) {
              __assert_fail("Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x126,"int Bac_ObjNextFanout(Bac_Ntk_t *, int)");
            }
            if ((p->vFanout).nSize <= (int)uVar4) goto LAB_0038a166;
            uVar4 = (p->vFanout).pArray[uVar4];
          } while (uVar4 != 0);
        }
        iVar2 = (p->vType).nSize;
        if (iVar2 <= iOld) goto LAB_0038a147;
        pcVar3 = (p->vType).pArray;
        uVar4 = (uint)(byte)pcVar3[(uint)iOld];
        if ((9 < uVar4) || ((0x30cU >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_0038a220;
        if ((p->vFanout).nSize <= iOld) goto LAB_0038a166;
        if (iNew < iVar2) {
          uVar4 = (uint)(byte)pcVar3[(uint)iNew];
          if ((uVar4 < 10) && ((0x30cU >> (uVar4 & 0x1f) & 1) != 0)) {
            Vec_IntSetEntry(&p->vFanout,iNew,(p->vFanout).pArray[(uint)iOld]);
            if ((p->vType).nSize <= iOld) goto LAB_0038a147;
            uVar4 = (uint)(byte)(p->vType).pArray[(uint)iOld];
            if ((uVar4 < 10) && ((0x30cU >> (uVar4 & 0x1f) & 1) != 0)) {
              Vec_IntSetEntry(&p->vFanout,iOld,0);
              return;
            }
          }
          __assert_fail("Bac_ObjIsCi(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0x127,"void Bac_ObjSetFanout(Bac_Ntk_t *, int, int)");
        }
      }
    }
  }
LAB_0038a147:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

void Bac_NtkUpdateFanout( Bac_Ntk_t * p, int iOld, int iNew )
{
    int iCo;
    assert( Bac_ObjIsCi(p, iOld) );
    assert( Bac_ObjIsCi(p, iNew) );
    Bac_ObjForEachFanout( p, iOld, iCo )
    {
        assert( Bac_ObjFanin(p, iCo) == iOld );
        Bac_ObjCleanFanin( p, iCo );
        Bac_ObjSetFanin( p, iCo, iNew );
    }
    Bac_ObjSetFanout( p, iNew, Bac_ObjFanout(p, iOld) );
    Bac_ObjSetFanout( p, iOld, 0 );
}